

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O3

bool __thiscall
Minisat::OnlineProofChecker::removeClause<Minisat::vec<Minisat::Lit>>
          (OnlineProofChecker *this,vec<Minisat::Lit> *cls)

{
  int *piVar1;
  ulong *puVar2;
  int iVar3;
  Lit *pLVar4;
  pointer puVar5;
  pointer pvVar6;
  vec<Minisat::Watcher> *pvVar7;
  Watcher *pWVar8;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  pointer puVar21;
  long lVar22;
  ulong uVar23;
  
  if (3 < this->verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] remove clause ",0x1c);
    if (0 < cls->sz) {
      lVar12 = 0;
      do {
        uVar11 = cls->data[lVar12].x;
        uVar14 = (int)uVar11 >> 1;
        uVar16 = ~uVar14;
        if ((uVar11 & 1) == 0) {
          uVar16 = uVar14 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar16);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        lVar12 = lVar12 + 1;
      } while (lVar12 < cls->sz);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
    std::ostream::put('X');
    std::ostream::flush();
    printState(this);
  }
  bVar13 = true;
  if ((cls->sz != 0) && (this->ok == true)) {
    if (cls->sz == 1) {
      lVar12 = (long)(this->unitClauses).sz;
      if (0 < lVar12) {
        pLVar4 = (this->unitClauses).data;
        lVar10 = 0;
        do {
          if (pLVar4[lVar10].x == cls->data->x) {
            pLVar4[lVar10].x = pLVar4[lVar12 + -1].x;
            piVar1 = &(this->unitClauses).sz;
            *piVar1 = *piVar1 + -1;
            if (this->verbose < 2) {
              return true;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
            if (0 < cls->sz) {
              lVar12 = 0;
              do {
                uVar11 = cls->data[lVar12].x;
                uVar14 = (int)uVar11 >> 1;
                uVar16 = ~uVar14;
                if ((uVar11 & 1) == 0) {
                  uVar16 = uVar14 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar16);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                lVar12 = lVar12 + 1;
              } while (lVar12 < cls->sz);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
LAB_00125d58:
            std::ostream::put('X');
            std::ostream::flush();
            return true;
          }
          lVar10 = lVar10 + 1;
        } while (lVar12 != lVar10);
      }
    }
    else {
      uVar11 = (this->ma).step;
      if (0x3fffffff < uVar11) {
        puVar5 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar11 = 0;
        memset(puVar5,0,(long)(this->ma).array.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar5);
      }
      (this->ma).step = uVar11 + 1;
      pLVar4 = cls->data;
      puVar5 = (this->ma).array.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar5[(uint)pLVar4->x] = uVar11 + 1;
      uVar18 = (ulong)(uint)cls->sz;
      uVar11 = 0;
      pvVar6 = (this->occ).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (1 < cls->sz) {
        uVar16 = (this->ma).step;
        uVar11 = 0;
        lVar12 = 1;
        do {
          puVar5[(uint)pLVar4[lVar12].x] = uVar16;
          uVar14 = (uint)lVar12;
          if ((ulong)((long)*(pointer *)
                             ((long)&pvVar6[(int)uVar11].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar6[(int)uVar11].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data) <=
              (ulong)((long)*(pointer *)
                             ((long)&pvVar6[pLVar4[lVar12].x].
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data + 8) -
                     *(long *)&pvVar6[pLVar4[lVar12].x].
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data)) {
            uVar14 = uVar11;
          }
          uVar11 = uVar14;
          lVar12 = lVar12 + 1;
          uVar18 = (ulong)cls->sz;
        } while (lVar12 < (long)uVar18);
      }
      iVar3 = pLVar4[(int)uVar11].x;
      uVar20 = (ulong)iVar3;
      lVar12 = *(long *)&pvVar6[uVar20].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data;
      puVar21 = *(pointer *)
                 ((long)&pvVar6[uVar20].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data + 8);
      lVar10 = (long)puVar21 - lVar12;
      if (lVar10 != 0) {
        puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        lVar19 = 0;
LAB_0012562b:
        uVar16 = *(uint *)(lVar12 + lVar19 * 4);
        if ((uint)uVar18 == (uint)(*(ulong *)(puVar9 + uVar16) >> 0x22)) {
          if (*(ulong *)(puVar9 + uVar16) < 0x400000000) {
LAB_00125680:
            *(undefined4 *)(lVar12 + lVar19 * 4) = *(undefined4 *)(lVar12 + -4 + lVar10);
            puVar21 = puVar21 + -1;
            *(pointer *)
             ((long)&pvVar6[uVar20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data + 8) = puVar21;
            if (((long)puVar21 - lVar12 == -4) || (uVar16 == 0xffffffff)) goto LAB_001259f7;
            if (0 < cls->sz) {
              uVar18 = 0;
              do {
                if (uVar18 != uVar11) {
                  pvVar6 = (this->occ).
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + cls->data[uVar18].x;
                  lVar12 = *(long *)&(pvVar6->
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     )._M_impl.super__Vector_impl_data;
                  puVar5 = *(pointer *)
                            ((long)&(pvVar6->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data + 8);
                  lVar10 = (long)puVar5 - lVar12 >> 2;
                  if ((long)puVar5 - lVar12 == 0) {
                    lVar19 = 0;
                  }
                  else {
                    lVar19 = lVar10 + (ulong)(lVar10 == 0);
                    lVar22 = 0;
                    do {
                      if (*(uint *)(lVar12 + lVar22 * 4) == uVar16) {
                        *(undefined4 *)(lVar12 + lVar22 * 4) =
                             *(undefined4 *)(lVar12 + -4 + ((long)puVar5 - lVar12));
                        *(pointer *)
                         ((long)&(pvVar6->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + 8) = puVar5 + -1;
                        lVar10 = (long)(puVar5 + -1) - lVar12 >> 2;
                        lVar19 = -1;
                        break;
                      }
                      lVar22 = lVar22 + 1;
                    } while (lVar19 != lVar22);
                  }
                  if (lVar19 == lVar10) {
                    if (1 < this->verbose) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"c could not remove clause ",0x1a);
                      if (0 < cls->sz) {
                        lVar12 = 0;
                        do {
                          uVar14 = cls->data[lVar12].x;
                          uVar15 = (int)uVar14 >> 1;
                          uVar17 = ~uVar15;
                          if ((uVar14 & 1) == 0) {
                            uVar17 = uVar15 + 1;
                          }
                          std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                          std::ostream::flush();
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr," ",1);
                          lVar12 = lVar12 + 1;
                        } while (lVar12 < cls->sz);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr," from list of literal ",0x16);
                      uVar14 = cls->data[uVar18].x;
                      uVar15 = (int)uVar14 >> 1;
                      uVar17 = ~uVar15;
                      if ((uVar14 & 1) == 0) {
                        uVar17 = uVar15 + 1;
                      }
                      std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                      std::ostream::flush();
                      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                      std::ostream::put('X');
                      std::ostream::flush();
                    }
                    printState(this);
                    if (2 < this->verbose) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"c list for ",0xb);
                      uVar14 = cls->data[uVar18].x;
                      uVar15 = (int)uVar14 >> 1;
                      uVar17 = ~uVar15;
                      if ((uVar14 & 1) == 0) {
                        uVar17 = uVar15 + 1;
                      }
                      std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr," : ",3);
                      if (*(pointer *)
                           ((long)&(pvVar6->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data + 8) !=
                          (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start) {
                        uVar20 = 0;
                        do {
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,"c ",2);
                          uVar14 = *(uint *)(*(long *)&(pvVar6->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + uVar20 * 4);
                          puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
                          if (0x3ffffffff < *(ulong *)(puVar9 + uVar14)) {
                            puVar2 = (ulong *)(puVar9 + uVar14);
                            uVar23 = 0;
                            do {
                              uVar14 = *(uint *)((long)puVar2 + uVar23 * 4 + 8);
                              uVar15 = (int)uVar14 >> 1;
                              uVar17 = ~uVar15;
                              if ((uVar14 & 1) == 0) {
                                uVar17 = uVar15 + 1;
                              }
                              std::ostream::operator<<((ostream *)&std::cerr,uVar17);
                              std::ostream::flush();
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&std::cerr," ",1);
                              uVar23 = uVar23 + 1;
                            } while (uVar23 < *puVar2 >> 0x22);
                          }
                          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
                          std::ostream::put('X');
                          std::ostream::flush();
                          uVar20 = uVar20 + 1;
                        } while (uVar20 < (ulong)((long)*(pointer *)
                                                         ((long)&(pvVar6->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                                  *(long *)&(pvVar6->
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  )._M_impl.super__Vector_impl_data >> 2));
                      }
                    }
                  }
                }
                uVar18 = uVar18 + 1;
              } while ((long)uVar18 < (long)cls->sz);
              puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            }
            uVar18 = (long)(int)puVar9[(ulong)uVar16 + 2] ^ 1;
            pvVar7 = (this->watches).occs.data;
            lVar12 = (long)pvVar7[uVar18].sz;
            pWVar8 = pvVar7[uVar18].data;
            if (lVar12 < 1) {
              lVar10 = 0;
            }
            else {
              lVar19 = 0;
              do {
                lVar10 = lVar19;
                if (pWVar8[lVar19].cref == uVar16) break;
                lVar19 = lVar19 + 1;
                lVar10 = lVar12;
              } while (lVar12 != lVar19);
            }
            pWVar8[lVar10] = pWVar8[lVar12 + -1];
            pvVar7[uVar18].sz = pvVar7[uVar18].sz + -1;
            uVar18 = (long)(int)puVar9[(ulong)uVar16 + 3] ^ 1;
            pvVar7 = (this->watches).occs.data;
            lVar10 = (long)pvVar7[uVar18].sz;
            pWVar8 = pvVar7[uVar18].data;
            lVar19 = 0;
            lVar12 = lVar19;
            if (0 < lVar10) {
              do {
                lVar12 = lVar19;
                if (pWVar8[lVar19].cref == uVar16) break;
                lVar19 = lVar19 + 1;
                lVar12 = lVar10;
              } while (lVar10 != lVar19);
            }
            pWVar8[lVar12] = pWVar8[lVar10 + -1];
            pvVar7[uVar18].sz = pvVar7[uVar18].sz + -1;
            puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            *(ulong *)(puVar9 + uVar16) = (*(ulong *)(puVar9 + uVar16) & 0xfffffffffffffffc) + 1;
            uVar18 = *(ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar16);
            uVar11 = 2;
            if ((uVar18 & 4) == 0) {
              uVar11 = (uint)(uVar18 >> 3) & 1;
            }
            (this->ca).super_RegionAllocator<unsigned_int>.wasted_ =
                 (uint)(uVar18 >> 0x22) + (this->ca).super_RegionAllocator<unsigned_int>.wasted_ +
                 uVar11 + 2;
            if (this->verbose < 2) {
              return true;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"c [DRAT-OTFC] removed clause ",0x1d);
            if (0 < cls->sz) {
              lVar12 = 0;
              do {
                uVar11 = cls->data[lVar12].x;
                uVar17 = (int)uVar11 >> 1;
                uVar14 = ~uVar17;
                if ((uVar11 & 1) == 0) {
                  uVar14 = uVar17 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar14);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                lVar12 = lVar12 + 1;
              } while (lVar12 < cls->sz);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr," which is internally ",0x15);
            puVar9 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
            if (0x3ffffffff < *(ulong *)(puVar9 + uVar16)) {
              puVar2 = (ulong *)(puVar9 + uVar16);
              uVar18 = 0;
              do {
                uVar11 = *(uint *)((long)puVar2 + uVar18 * 4 + 8);
                uVar14 = (int)uVar11 >> 1;
                uVar16 = ~uVar14;
                if ((uVar11 & 1) == 0) {
                  uVar16 = uVar14 + 1;
                }
                std::ostream::operator<<((ostream *)&std::cerr,uVar16);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                uVar18 = uVar18 + 1;
              } while (uVar18 < *puVar2 >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
            goto LAB_00125d58;
          }
          uVar23 = 0;
          while (puVar5[puVar9[(ulong)uVar16 + uVar23 + 2]] == (this->ma).step) {
            uVar23 = uVar23 + 1;
            if ((uVar18 & 0xffffffff) == uVar23) goto LAB_00125680;
          }
        }
        lVar19 = lVar19 + 1;
        if (lVar19 == (lVar10 >> 2) + (ulong)(lVar10 >> 2 == 0)) goto LAB_001259f7;
        goto LAB_0012562b;
      }
LAB_001259f7:
      if (1 < this->verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] could not remove clause ",0x26);
        if (0 < cls->sz) {
          lVar12 = 0;
          do {
            uVar11 = cls->data[lVar12].x;
            uVar14 = (int)uVar11 >> 1;
            uVar16 = ~uVar14;
            if ((uVar11 & 1) == 0) {
              uVar16 = uVar14 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar16);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            lVar12 = lVar12 + 1;
          } while (lVar12 < cls->sz);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," from list of literal ",0x16);
        uVar16 = iVar3 >> 1;
        uVar11 = ~uVar16;
        if ((uVar20 & 1) == 0) {
          uVar11 = uVar16 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar11);
        std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'X');
        std::ostream::put('X');
        std::ostream::flush();
      }
      printState(this);
    }
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

inline bool OnlineProofChecker::removeClause(const T &cls)
{
    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] remove clause " << cls << std::endl;
        printState();
    }

    if (cls.size() == 0 || !ok) {
        return true;
    } // do not handle empty clauses here!
    if (cls.size() == 1) {
        const Lit l = cls[0];
        int i = 0;
        bool found = false;
        for (; i < unitClauses.size(); ++i) {
            if (unitClauses[i] == l) {
                unitClauses[i] = unitClauses[unitClauses.size() - 1];
                unitClauses.pop();
                found = true;
                break; // remove only once!
            }
        }
        if (!found) {
            assert(false && "the unit clause should be inside the vector of units");
            return false;
        }
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] removed clause " << cls << std::endl;
        }
        return true;
    }
    // find correct CRef ...
    ma.nextStep();
    int smallestIndex = 0;
    ma.setCurrentStep(toInt(cls[0]));
    for (int i = 1; i < cls.size(); ++i) {
        ma.setCurrentStep(toInt(cls[i]));
        if (occ[toInt(cls[i])].size() < occ[smallestIndex].size()) {
            smallestIndex = i;
        }
    }

    const Lit smallest = cls[smallestIndex];

    CRef ref = CRef_Undef;
    size_t i = 0;
    for (; i < occ[toInt(smallest)].size(); ++i) {
        const Clause &c = ca[occ[toInt(smallest)][i]];
        if (c.size() != cls.size()) {
            continue;
        } // do not check this clause!

        int hit = 0;
        for (; hit < c.size(); ++hit) {
            if (!ma.isCurrentStep(toInt(c[hit]))) {
                break;
            } // a literal is not in both clauses, not the correct clause
        }
        if (hit < c.size()) {
            continue;
        } // not the right clause -> check next!

        ref = occ[toInt(smallest)][i];
        // remove from this occ-list
        occ[toInt(smallest)][i] = occ[toInt(smallest)][occ[toInt(smallest)].size() - 1];
        occ[toInt(smallest)].pop_back();
        i = ~0; // set to indicate that we found the clause
        break;
    }
    if (i == occ[toInt(smallest)].size() || ref == CRef_Undef) {
        if (verbose > 1) {
            std::cerr << "c [DRAT-OTFC] could not remove clause " << cls << " from list of literal " << smallest << std::endl;
        }
        printState();
        assert(false && "clause should be in the data structures");
        return false;
    }

    // remove from the other occ-lists!
    for (int i = 0; i < cls.size(); ++i) {
        if (i == smallestIndex) {
            continue;
        }
        std::vector<CRef> &list = occ[toInt(cls[i])];
        size_t j = 0;
        for (; j < list.size(); ++j) {
            if (list[j] == ref) {
                list[j] = list[list.size() - 1];
                list.pop_back(); // remove the element
                j = -1;          // point somewhere invalid
                break;
            }
        }
        if (j == list.size()) {
            if (verbose > 1) {
                std::cerr << "c could not remove clause " << cls << " from list of literal " << cls[i] << std::endl;
            }
            printState();
            if (verbose > 2) {
                std::cerr << "c list for " << cls[i] << " : ";
                for (size_t k = 0; k < list.size(); ++k) {
                    std::cerr << "c " << ca[list[k]] << std::endl;
                }
            }
            assert(false && "should be able to remove the clause from all lists");
        }
    }

    // remove the clause from the two watched literal structures!
    detachClause(ref);

    // tell the garbage-collection-system that the clause can be removed
    ca[ref].mark(1);
    ca.free(ref);

    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] removed clause " << cls << " which is internally " << ca[ref] << std::endl;
    }
    // check garbage collection once in a while!
    // TODO
    return true;
}